

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceInfoLinCWrapper.cpp
# Opt level: O0

int GmmDeviceCallback(GMM_CLIENT ClientType,GMM_DEVICE_CALLBACKS_INT *pDeviceCb,
                     GMM_DDI_ALLOCATE *pAllocate)

{
  int iVar1;
  uint64_t local_40;
  uint64_t gpuAddr;
  void *pCpuAddr;
  void *pBo;
  GMM_DDI_ALLOCATE *pGStack_20;
  int Status;
  GMM_DDI_ALLOCATE *pAllocate_local;
  GMM_DEVICE_CALLBACKS_INT *pDeviceCb_local;
  GMM_CLIENT ClientType_local;
  
  pBo._4_4_ = 0;
  pCpuAddr = (void *)0x0;
  gpuAddr = 0;
  local_40 = 0;
  pGStack_20 = pAllocate;
  pAllocate_local = (GMM_DDI_ALLOCATE *)pDeviceCb;
  pDeviceCb_local._4_4_ = ClientType;
  iVar1 = (*(pDeviceCb->DevCbPtrs_).pfnAllocate)
                    (pDeviceCb->pBufMgr,pAllocate->size,pAllocate->alignment,&pCpuAddr,
                     (void **)&gpuAddr,&local_40);
  pGStack_20->bo = pCpuAddr;
  pGStack_20->cpuAddr = (void *)gpuAddr;
  pGStack_20->gfxAddr = local_40;
  return iVar1;
}

Assistant:

int GmmDeviceCallback(GMM_CLIENT ClientType, GMM_DEVICE_CALLBACKS_INT *pDeviceCb, GMM_DDI_ALLOCATE *pAllocate)
{
    int      Status   = 0;
    void *   pBo      = NULL;
    void *   pCpuAddr = NULL;
    uint64_t gpuAddr  = 0ULL;

    Status = pDeviceCb->DevCbPtrs_.pfnAllocate(pDeviceCb->pBufMgr,
                                               pAllocate->size,
                                               pAllocate->alignment,
                                               &pBo,
                                               &pCpuAddr,
                                               &gpuAddr);
    pAllocate->bo      = pBo;
    pAllocate->cpuAddr = pCpuAddr;
    pAllocate->gfxAddr = gpuAddr;

    return Status;
}